

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_get_node_siblings(lyd_node *data,lys_node *schema,ly_set *set)

{
  uint uVar1;
  
  if (set->number != 0) {
    __assert_fail("set && !set->number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x31,
                  "int lyd_get_node_siblings(const struct lyd_node *, const struct lys_node *, struct ly_set *)"
                 );
  }
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x32,
                  "int lyd_get_node_siblings(const struct lyd_node *, const struct lys_node *, struct ly_set *)"
                 );
  }
  if ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN) {
    __assert_fail("schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x34,
                  "int lyd_get_node_siblings(const struct lyd_node *, const struct lys_node *, struct ly_set *)"
                 );
  }
  if (data == (lyd_node *)0x0) {
    uVar1 = 0;
  }
  else {
    do {
      if (data->schema == schema) {
        ly_set_add(set,data,1);
      }
      data = data->next;
    } while (data != (lyd_node *)0x0);
    uVar1 = set->number;
  }
  return uVar1;
}

Assistant:

static int
lyd_get_node_siblings(const struct lyd_node *data, const struct lys_node *schema, struct ly_set *set)
{
    const struct lyd_node *iter;

    assert(set && !set->number);
    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC |
                               LYS_ACTION));

    if (!data) {
        return 0;
    }

    LY_TREE_FOR(data, iter) {
        if (iter->schema == schema) {
            ly_set_add(set, (void*)iter, LY_SET_OPT_USEASLIST);
        }
    }

    return set->number;
}